

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * Pathie::Path::mktmpdir(Path *__return_storage_ptr__,string *name)

{
  char *__file;
  __mode_t __mode;
  Path *this;
  undefined1 local_b0 [8];
  string nstr;
  Path local_80;
  Path local_60;
  Path local_40;
  byte local_19;
  string *local_18;
  string *name_local;
  Path *tmp;
  
  local_19 = 0;
  local_18 = name;
  name_local = &__return_storage_ptr__->m_path;
  temp_dir();
  make_tempname(&local_80,local_18);
  Path(&local_60,&local_80.m_path);
  this = &local_40;
  operator/(__return_storage_ptr__,this,&local_60);
  ~Path(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  ~Path(&local_40);
  mkdir(__return_storage_ptr__,(char *)this,__mode);
  native_abi_cxx11_((Path *)local_b0);
  __file = (char *)std::__cxx11::string::c_str();
  chmod(__file,0x1c0);
  local_19 = 1;
  std::__cxx11::string::~string((string *)local_b0);
  if ((local_19 & 1) == 0) {
    ~Path(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::mktmpdir(const std::string& name /* = "tmpd" */)
{
  Path tmp = Path::temp_dir() / Path(make_tempname(name));
  tmp.mkdir();

#ifdef _PATHIE_UNIX
  std::string nstr = tmp.native();
  chmod(nstr.c_str(), S_IRWXU); // Silently ignore failure of setting file permissions
#endif
  // TODO: How to do that on Windows?

  return tmp;
}